

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzrule.cpp
# Opt level: O1

TimeArrayTimeZoneRule * __thiscall
icu_63::TimeArrayTimeZoneRule::operator=(TimeArrayTimeZoneRule *this,TimeArrayTimeZoneRule *right)

{
  uint in_EAX;
  UErrorCode status;
  undefined8 uStack_18;
  
  if (this != right) {
    uStack_18._0_4_ = in_EAX;
    UnicodeString::operator=(&(this->super_TimeZoneRule).fName,&(right->super_TimeZoneRule).fName);
    (this->super_TimeZoneRule).fRawOffset = (right->super_TimeZoneRule).fRawOffset;
    (this->super_TimeZoneRule).fDSTSavings = (right->super_TimeZoneRule).fDSTSavings;
    uStack_18 = (ulong)(uint)uStack_18;
    initStartTimes(this,right->fStartTimes,right->fNumStartTimes,
                   (UErrorCode *)((long)&uStack_18 + 4));
    this->fTimeRuleType = right->fTimeRuleType;
  }
  return this;
}

Assistant:

TimeArrayTimeZoneRule&
TimeArrayTimeZoneRule::operator=(const TimeArrayTimeZoneRule& right) {
    if (this != &right) {
        TimeZoneRule::operator=(right);
        UErrorCode status = U_ZERO_ERROR;
        initStartTimes(right.fStartTimes, right.fNumStartTimes, status);
        //TODO - status?
        fTimeRuleType = right.fTimeRuleType;        
    }
    return *this;
}